

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_casts.cpp
# Opt level: O2

BoundCastInfo *
duckdb::DefaultCasts::ImplicitToUnionCast
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  bool bVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_38;
  BoundCastData *local_30;
  
  bVar1 = StructToUnionCast::AllowImplicitCastFromStruct(source,target);
  if (bVar1) {
    StructToUnionCast::Bind(__return_storage_ptr__,input,source,target);
  }
  else {
    BindToUnionCast((duckdb *)&local_30,input,source,target);
    local_38._M_head_impl = local_30;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ToUnionCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_38,InitToUnionLocalState);
    if (local_38._M_head_impl != (BoundCastData *)0x0) {
      (*(local_38._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::ImplicitToUnionCast(BindCastInput &input, const LogicalType &source,
                                                const LogicalType &target) {

	D_ASSERT(target.id() == LogicalTypeId::UNION);
	if (StructToUnionCast::AllowImplicitCastFromStruct(source, target)) {
		return StructToUnionCast::Bind(input, source, target);
	}
	auto cast_data = BindToUnionCast(input, source, target);
	return BoundCastInfo(&ToUnionCast, std::move(cast_data), InitToUnionLocalState);
}